

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

BVSparseNode * __thiscall
BVSparse<Memory::JitArenaAllocator>::NodeFromIndex
          (BVSparse<Memory::JitArenaAllocator> *this,BVIndex i,Type **prevNextFieldOut,bool create)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  Type pBVar2;
  BVSparse<Memory::JitArenaAllocator> *pBVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  uint uVar5;
  
  uVar5 = i & 0xffffffc0;
  pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)this->lastUsedNodePrevNextField;
  pBVar1 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
  if (pBVar1 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if (*(uint *)&pBVar1->lastFoundIndex == uVar5) {
      *prevNextFieldOut = (Type *)pBVar4;
      return (BVSparseNode *)pBVar1;
    }
    if (*(uint *)&pBVar1->lastFoundIndex <= uVar5) goto LAB_003f7325;
  }
  pBVar1 = (BVSparse<Memory::JitArenaAllocator> *)this->head;
  pBVar4 = this;
LAB_003f7325:
  do {
    pBVar3 = pBVar1;
    if (pBVar3 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_003f733f:
      if (create) {
        pBVar2 = pBVar4->head;
        pBVar3 = (BVSparse<Memory::JitArenaAllocator> *)
                 new<Memory::JitArenaAllocator>(0x18,this->alloc,0x3f1274);
        pBVar3->head = pBVar2;
        *(uint *)&pBVar3->lastFoundIndex = uVar5;
        ((Type *)&pBVar3->alloc)->word = 0;
        pBVar4->head = (Type_conflict)pBVar3;
LAB_003f7371:
        *prevNextFieldOut = &pBVar4->head;
        this->lastUsedNodePrevNextField = &pBVar4->head;
      }
      else {
        pBVar3 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      }
      return (BVSparseNode *)pBVar3;
    }
    if (uVar5 <= *(uint *)&pBVar3->lastFoundIndex) {
      if (uVar5 == *(uint *)&pBVar3->lastFoundIndex) goto LAB_003f7371;
      goto LAB_003f733f;
    }
    pBVar1 = (BVSparse<Memory::JitArenaAllocator> *)pBVar3->head;
    pBVar4 = pBVar3;
  } while( true );
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator)** prevNextFieldOut, bool create)
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator)* prevNextField = this->lastUsedNodePrevNextField;
    BVSparseNode* curNode = *prevNextField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    if(curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        this->lastUsedNodePrevNextField = prevNextField;
        return curNode;
    }

    if(!create)
    {
        return nullptr;
    }

    BVSparseNode * newNode = Allocate(searchIndex, *prevNextField);
    *prevNextField = newNode;
    *prevNextFieldOut = prevNextField;
    this->lastUsedNodePrevNextField = prevNextField;
    return newNode;
}